

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerRequirementsDocs.cpp
# Opt level: O2

void __thiscall
VerifyAllCombinationsOnContainer::MinimalContainerInterfaceForVerifyAllCombinations::
MinimalContainerInterfaceForVerifyAllCombinations
          (MinimalContainerInterfaceForVerifyAllCombinations *this)

{
  int local_1c [3];
  
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)this);
  local_1c[2] = 10;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this->super_ContainerType,local_1c + 2);
  local_1c[1] = 0x14;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this->super_ContainerType,local_1c + 1);
  local_1c[0] = 0x1e;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this->super_ContainerType,local_1c);
  return;
}

Assistant:

MinimalContainerInterfaceForVerifyAllCombinations()
        {
            push_back(10);
            push_back(20);
            push_back(30);
        }